

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall
helics::HandleManager::removeFederateHandles(HandleManager *this,GlobalFederateId fedToRemove)

{
  bool bVar1;
  BaseType in_ESI;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *in_RDI;
  BasicHandleInfo *handle;
  iterator __end1;
  iterator __begin1;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *__range1;
  HandleManager *in_stack_000000a8;
  GlobalHandle in_stack_000000b0;
  GlobalHandle in_stack_ffffffffffffff90;
  GlobalFederateId local_64;
  reference local_60;
  _Self local_58;
  _Self local_38;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::begin(in_RDI);
  std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::end(in_RDI);
  while (bVar1 = std::operator==(&local_38,&local_58), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_60 = std::
               _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
               ::operator*(&local_38);
    local_64 = BasicHandleInfo::getFederateId(local_60);
    bVar1 = GlobalFederateId::operator==(&local_64,local_4);
    if (bVar1) {
      in_stack_ffffffffffffff90 = local_60->handle;
      removeHandle(in_stack_000000a8,in_stack_000000b0);
    }
    std::
    _Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>::
    operator++((_Deque_iterator<helics::BasicHandleInfo,_helics::BasicHandleInfo_&,_helics::BasicHandleInfo_*>
                *)in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

void HandleManager::removeFederateHandles(GlobalFederateId fedToRemove)
{
    for (auto& handle : handles) {
        if (handle.getFederateId() == fedToRemove) {
            removeHandle(handle.handle);
        }
    }
}